

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_by_value.cpp
# Opt level: O1

void f(int *i)

{
  spin_mutex_t sVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f begin: ",9);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  mywait(1.0);
  do {
  } while (*i == 0);
  *i = 10;
  do {
    sVar1.lock_.super___atomic_flag_base._M_i = my_io_mutex.lock_.super___atomic_flag_base._M_i;
    LOCK();
    my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x1;
    UNLOCK();
  } while ((__atomic_flag_base)sVar1.lock_.super___atomic_flag_base._M_i != false);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"f finish: ",10);
  lVar2 = std::chrono::_V2::system_clock::now();
  poVar3 = std::ostream::_M_insert<double>((double)(lVar2 - (long)t0.__d.__r) / 1000000000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," with i=",8);
  plVar4 = (long *)std::ostream::operator<<(poVar3,*i);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  my_io_mutex.lock_.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  return;
}

Assistant:

void f(volatile int &i) {
  LOG("f begin: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count());
  
  // This is just used to make a delay
  mywait(1.0);
  
  while (!i) {
    /* wait */
  }
  
  i = 10;
  
  LOG("f finish: " << std::chrono::duration<double>(std::chrono::high_resolution_clock::now() - t0).count() << " with i=" << i);
}